

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckOpcode2(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Result RVar1;
  Type TVar2;
  Type expected2;
  char *desc;
  Opcode local_2c;
  
  local_2c.enum_ = opcode.enum_;
  TVar2 = Opcode::GetParamType1(&local_2c);
  if (limits != (Limits *)0x0) {
    TVar2 = (Type)~(ulong)limits->is_64;
  }
  expected2 = Opcode::GetParamType2(&local_2c);
  desc = Opcode::GetName(&local_2c);
  RVar1 = PopAndCheck2Types(this,TVar2,expected2,desc);
  TVar2 = Opcode::GetResultType(&local_2c);
  PushType(this,TVar2);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode2(Opcode opcode, const Limits* limits) {
  Result result =
      PopAndCheck2Types(GetMemoryParam(opcode.GetParamType1(), limits),
                        opcode.GetParamType2(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}